

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O0

void plutovg_canvas_font_metrics
               (plutovg_canvas_t *canvas,float *ascent,float *descent,float *line_gap,
               plutovg_rect_t *extents)

{
  plutovg_state_t *ppVar1;
  plutovg_state_t *state;
  plutovg_rect_t *extents_local;
  float *line_gap_local;
  float *descent_local;
  float *ascent_local;
  plutovg_canvas_t *canvas_local;
  
  ppVar1 = canvas->state;
  if ((ppVar1->font_face == (plutovg_font_face_t *)0x0) || (ppVar1->font_size <= 0.0)) {
    if (ascent != (float *)0x0) {
      *ascent = 0.0;
    }
    if (descent != (float *)0x0) {
      *descent = 0.0;
    }
    if (line_gap != (float *)0x0) {
      *line_gap = 0.0;
    }
    if (extents != (plutovg_rect_t *)0x0) {
      extents->x = 0.0;
      extents->y = 0.0;
      extents->w = 0.0;
      extents->h = 0.0;
    }
  }
  else {
    plutovg_font_face_get_metrics
              (ppVar1->font_face,ppVar1->font_size,ascent,descent,line_gap,extents);
  }
  return;
}

Assistant:

void plutovg_canvas_font_metrics(const plutovg_canvas_t* canvas, float* ascent, float* descent, float* line_gap, plutovg_rect_t* extents)
{
    plutovg_state_t* state = canvas->state;
    if(state->font_face && state->font_size > 0.f) {
        plutovg_font_face_get_metrics(state->font_face, state->font_size, ascent, descent, line_gap, extents);
        return;
    }

    if(ascent) *ascent = 0.f;
    if(descent) *descent = 0.f;
    if(line_gap) *line_gap = 0.f;
    if(extents) {
        extents->x = 0.f;
        extents->y = 0.f;
        extents->w = 0.f;
        extents->h = 0.f;
    }
}